

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  xpath_ast_node *in_RSI;
  xpath_allocator *in_RDI;
  xpath_ast_node *unaff_retaddr;
  xpath_allocator *alloc_00;
  
  alloc_00 = in_RDI;
  if (in_RDI->_root_size != 0) {
    optimize(in_RSI,in_RDI);
  }
  if (in_RDI->_error != (bool *)0x0) {
    optimize(in_RSI,in_RDI);
  }
  if (in_RDI[1]._root != (xpath_memory_block *)0x0) {
    optimize(in_RSI,in_RDI);
  }
  optimize_self(unaff_retaddr,alloc_00);
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}